

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerSafe::EnergyScan
          (CommissionerSafe *this,ErrorHandler *aHandler,uint32_t aChannelMask,uint8_t aCount,
          uint16_t aPeriod,uint16_t aScanDuration,string *aDstAddr)

{
  _func_void *p_Var1;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  CommissionerSafe *local_88;
  _Any_data local_80;
  long local_70;
  undefined8 uStack_68;
  uint32_t local_60;
  uint8_t uStack_5c;
  undefined1 uStack_5b;
  uint16_t uStack_5a;
  uint16_t local_58;
  string local_50 [32];
  
  local_88 = this;
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_80,aHandler);
  local_60 = aChannelMask;
  uStack_5c = aCount;
  uStack_5a = aPeriod;
  local_58 = aScanDuration;
  std::__cxx11::string::string(local_50,(string *)aDstAddr);
  local_98 = (code *)0x0;
  pcStack_90 = (code *)0x0;
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  p_Var1 = (_func_void *)operator_new(0x58);
  *(CommissionerSafe **)p_Var1 = local_88;
  *(undefined8 *)(p_Var1 + 8) = 0;
  *(undefined8 *)(p_Var1 + 0x10) = 0;
  *(undefined8 *)(p_Var1 + 0x18) = 0;
  *(undefined8 *)(p_Var1 + 0x20) = uStack_68;
  if (local_70 != 0) {
    *(void **)(p_Var1 + 8) = local_80._M_unused._M_object;
    *(undefined8 *)(p_Var1 + 0x10) = local_80._8_8_;
    *(long *)(p_Var1 + 0x18) = local_70;
    local_70 = 0;
    uStack_68 = 0;
  }
  *(uint16_t *)(p_Var1 + 0x30) = local_58;
  *(ulong *)(p_Var1 + 0x28) = CONCAT26(uStack_5a,CONCAT15(uStack_5b,CONCAT14(uStack_5c,local_60)));
  std::__cxx11::string::string((string *)(p_Var1 + 0x38),local_50);
  pcStack_90 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:509:22)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:509:22)>
             ::_M_manager;
  local_a8._M_unused._0_8_ = (undefined8)p_Var1;
  PushAsyncRequest(this,(AsyncRequest *)&local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  EnergyScan(std::function<void(ot::commissioner::Error)>,unsigned_int,unsigned_char,unsigned_short,unsigned_short,std::__cxx11::string_const&)
  ::$_0::~__0((__0 *)&local_88);
  return;
}

Assistant:

void CommissionerSafe::EnergyScan(ErrorHandler       aHandler,
                                  uint32_t           aChannelMask,
                                  uint8_t            aCount,
                                  uint16_t           aPeriod,
                                  uint16_t           aScanDuration,
                                  const std::string &aDstAddr)
{
    PushAsyncRequest([=]() { mImpl->EnergyScan(aHandler, aChannelMask, aCount, aPeriod, aScanDuration, aDstAddr); });
}